

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldConvertorsTests::TestdoubleConvertTo::~TestdoubleConvertTo(TestdoubleConvertTo *this)

{
  TestdoubleConvertTo *this_local;
  
  ~TestdoubleConvertTo(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(doubleConvertTo)
{
  CHECK_EQUAL( "45.32", DoubleConvertor::convert( 45.32 ) );
  CHECK_EQUAL( "45", DoubleConvertor::convert( 45 ) );
  CHECK_EQUAL( "0", DoubleConvertor::convert( 0.0 ) );
  CHECK_EQUAL( "0.00001", DoubleConvertor::convert( 0.00001 ) );
  CHECK_EQUAL( "-12.000000000001", DoubleConvertor::convert( -12.000000000001 ) );
  CHECK_EQUAL( "-0.00001", DoubleConvertor::convert( -0.00001 ) );
  CHECK_EQUAL( "-1050", DoubleConvertor::convert( -1050.0 ) );
  CHECK_EQUAL( "1.233", DoubleConvertor::convert( 1.233 ) );
  CHECK_EQUAL( "38.4", DoubleConvertor::convert( 38.4 ) );
  CHECK_EQUAL( "38.4", DoubleConvertor::convert( 38.400000000000006 ) );
  CHECK_EQUAL( "0.1", DoubleConvertor::convert( 0.1 ) );
  CHECK_EQUAL( "0.3", DoubleConvertor::convert( 0.3 ) );

  // corner cases
  CHECK_EQUAL( "-0.000000000000001", DoubleConvertor::convert( -1e-15 ) );
  CHECK_EQUAL( "100000000000000", DoubleConvertor::convert( 1e14 ) );
  CHECK_EQUAL( "1e15", DoubleConvertor::convert( 1e15 ) );
  CHECK_EQUAL( "1.23456e15", DoubleConvertor::convert( 1.23456e15 ) );
  CHECK_EQUAL( "0.", DoubleConvertor::convert( 1e-16 ) );

  CHECK_EQUAL( "1.500", DoubleConvertor::convert( 1.5, 3) );
  CHECK_EQUAL( "45.00000", DoubleConvertor::convert( 45, 5) );
  CHECK_EQUAL( "5.00", DoubleConvertor::convert( 5, 2) );
  CHECK_EQUAL( "-5.00", DoubleConvertor::convert( -5, 2) );
  CHECK_EQUAL( "-12.2345", DoubleConvertor::convert( -12.2345, 2) );
  CHECK_EQUAL( "-0.00001", DoubleConvertor::convert( -0.00001, 5) );
  CHECK_EQUAL( "0.0", DoubleConvertor::convert( 0.0, 1) );

  CHECK_EQUAL( "", DoubleConvertor::convert( 0.01, 0, -1));
}